

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  uint num_bits;
  uint uVar5;
  
  pcVar3 = pD->m_dc_coeffs[component_id];
  puVar4 = pcVar3->pData;
  iVar1 = pcVar3->block_size;
  iVar2 = pcVar3->block_num_x;
  num_bits = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]]);
  if (num_bits == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = get_bits_no_markers(pD,num_bits);
    if ((int)uVar5 < *(int *)(s_extend_test + (ulong)(num_bits & 0xf) * 4)) {
      uVar5 = uVar5 + *(int *)(s_extend_offset + (ulong)(num_bits & 0xf) * 4);
    }
  }
  uVar5 = uVar5 + pD->m_last_dc_val[component_id];
  pD->m_last_dc_val[component_id] = uVar5;
  *(short *)(puVar4 + (long)(block_y * iVar1 * iVar2) + (long)(block_x * iVar1)) =
       (short)(uVar5 << ((byte)pD->m_successive_low & 0x1f));
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int s, r;
  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

  if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0) {
    r = pD->get_bits_no_markers(s);
    s = JPGD_HUFF_EXTEND(r, s);
  }

  pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

  p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
}